

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gregocal.cpp
# Opt level: O0

void __thiscall
icu_63::GregorianCalendar::handleComputeFields
          (GregorianCalendar *this,int32_t julianDay,UErrorCode *status)

{
  UBool UVar1;
  int iVar2;
  int iVar3;
  int32_t iVar4;
  bool bVar5;
  short local_62;
  uint local_50;
  int32_t era;
  int32_t gregShift;
  int32_t march1;
  int32_t correction;
  UBool isLeap;
  int32_t january1;
  int32_t julianEpochDay;
  int32_t unusedRemainder;
  int32_t dayOfYear;
  int32_t dayOfMonth;
  int32_t month;
  int32_t eyear;
  UErrorCode *status_local;
  GregorianCalendar *pGStack_10;
  int32_t julianDay_local;
  GregorianCalendar *this_local;
  
  _month = status;
  status_local._4_4_ = julianDay;
  pGStack_10 = this;
  UVar1 = ::U_FAILURE(*status);
  if (UVar1 == '\0') {
    if (status_local._4_4_ < this->fCutoverJulianDay) {
      iVar2 = status_local._4_4_ + -0x1a4450;
      dayOfMonth = ClockMath::floorDivide((double)iVar2 * 4.0 + 1464.0,0x5b5,&january1);
      iVar3 = dayOfMonth + -1;
      iVar4 = ClockMath::floorDivide(dayOfMonth + -1,4);
      iVar2 = iVar2 - (iVar3 * 0x16d + iVar4);
      bVar5 = (dayOfMonth & 3U) == 0;
      gregShift = 0;
      iVar3 = 0x3b;
      if (bVar5) {
        iVar3 = 0x3c;
      }
      if ((iVar3 <= iVar2) && (gregShift = 2, bVar5)) {
        gregShift = 1;
      }
      dayOfYear = ((iVar2 + gregShift) * 0xc + 6) / 0x16f;
      if (bVar5) {
        local_62 = kLeapNumDays[dayOfYear];
      }
      else {
        local_62 = kNumDays[dayOfYear];
      }
      unusedRemainder = (iVar2 - local_62) + 1;
      julianEpochDay = iVar2 + 1;
    }
    else {
      dayOfYear = Calendar::getGregorianMonth(&this->super_Calendar);
      unusedRemainder = Calendar::getGregorianDayOfMonth(&this->super_Calendar);
      julianEpochDay = Calendar::getGregorianDayOfYear(&this->super_Calendar);
      dayOfMonth = Calendar::getGregorianYear(&this->super_Calendar);
    }
    if ((dayOfMonth == this->fGregorianCutoverYear) &&
       (this->fCutoverJulianDay <= status_local._4_4_)) {
      iVar4 = Grego::gregorianShift(dayOfMonth);
      julianEpochDay = iVar4 + julianEpochDay;
    }
    Calendar::internalSet(&this->super_Calendar,UCAL_MONTH,dayOfYear);
    Calendar::internalSet(&this->super_Calendar,UCAL_DATE,unusedRemainder);
    Calendar::internalSet(&this->super_Calendar,UCAL_DAY_OF_YEAR,julianEpochDay);
    Calendar::internalSet(&this->super_Calendar,UCAL_EXTENDED_YEAR,dayOfMonth);
    bVar5 = dayOfMonth < 1;
    if (bVar5) {
      dayOfMonth = 1 - dayOfMonth;
    }
    local_50 = (uint)!bVar5;
    Calendar::internalSet(&this->super_Calendar,UCAL_ERA,local_50);
    Calendar::internalSet(&this->super_Calendar,UCAL_YEAR,dayOfMonth);
  }
  return;
}

Assistant:

void GregorianCalendar::handleComputeFields(int32_t julianDay, UErrorCode& status) {
    int32_t eyear, month, dayOfMonth, dayOfYear, unusedRemainder;


    if(U_FAILURE(status)) { 
        return; 
    }

#if defined (U_DEBUG_CAL)
    fprintf(stderr, "%s:%d: jd%d- (greg's %d)- [cut=%d]\n", 
        __FILE__, __LINE__, julianDay, getGregorianDayOfYear(), fCutoverJulianDay);
#endif


    if (julianDay >= fCutoverJulianDay) {
        month = getGregorianMonth();
        dayOfMonth = getGregorianDayOfMonth();
        dayOfYear = getGregorianDayOfYear();
        eyear = getGregorianYear();
    } else {
        // The Julian epoch day (not the same as Julian Day)
        // is zero on Saturday December 30, 0 (Gregorian).
        int32_t julianEpochDay = julianDay - (kJan1_1JulianDay - 2);
		eyear = (int32_t) ClockMath::floorDivide((4.0*julianEpochDay) + 1464.0, (int32_t) 1461, unusedRemainder);

        // Compute the Julian calendar day number for January 1, eyear
        int32_t january1 = 365*(eyear-1) + ClockMath::floorDivide(eyear-1, (int32_t)4);
        dayOfYear = (julianEpochDay - january1); // 0-based

        // Julian leap years occurred historically every 4 years starting
        // with 8 AD.  Before 8 AD the spacing is irregular; every 3 years
        // from 45 BC to 9 BC, and then none until 8 AD.  However, we don't
        // implement this historical detail; instead, we implement the
        // computatinally cleaner proleptic calendar, which assumes
        // consistent 4-year cycles throughout time.
        UBool isLeap = ((eyear&0x3) == 0); // equiv. to (eyear%4 == 0)

        // Common Julian/Gregorian calculation
        int32_t correction = 0;
        int32_t march1 = isLeap ? 60 : 59; // zero-based DOY for March 1
        if (dayOfYear >= march1) {
            correction = isLeap ? 1 : 2;
        }
        month = (12 * (dayOfYear + correction) + 6) / 367; // zero-based month
        dayOfMonth = dayOfYear - (isLeap?kLeapNumDays[month]:kNumDays[month]) + 1; // one-based DOM
        ++dayOfYear;
#if defined (U_DEBUG_CAL)
        //     fprintf(stderr, "%d - %d[%d] + 1\n", dayOfYear, isLeap?kLeapNumDays[month]:kNumDays[month], month );
        //           fprintf(stderr, "%s:%d:  greg's HCF %d -> %d/%d/%d not %d/%d/%d\n", 
        //                   __FILE__, __LINE__,julianDay,
        //          eyear,month,dayOfMonth,
        //          getGregorianYear(), getGregorianMonth(), getGregorianDayOfMonth()  );
        fprintf(stderr, "%s:%d: doy %d (greg's %d)- [cut=%d]\n", 
            __FILE__, __LINE__, dayOfYear, getGregorianDayOfYear(), fCutoverJulianDay);
#endif

    }

    // [j81] if we are after the cutover in its year, shift the day of the year
    if((eyear == fGregorianCutoverYear) && (julianDay >= fCutoverJulianDay)) {
        //from handleComputeMonthStart
        int32_t gregShift = Grego::gregorianShift(eyear);
#if defined (U_DEBUG_CAL)
        fprintf(stderr, "%s:%d:  gregorian shift %d :::  doy%d => %d [cut=%d]\n",
            __FILE__, __LINE__,gregShift, dayOfYear, dayOfYear+gregShift, fCutoverJulianDay);
#endif
        dayOfYear += gregShift;
    }

    internalSet(UCAL_MONTH, month);
    internalSet(UCAL_DAY_OF_MONTH, dayOfMonth);
    internalSet(UCAL_DAY_OF_YEAR, dayOfYear);
    internalSet(UCAL_EXTENDED_YEAR, eyear);
    int32_t era = AD;
    if (eyear < 1) {
        era = BC;
        eyear = 1 - eyear;
    }
    internalSet(UCAL_ERA, era);
    internalSet(UCAL_YEAR, eyear);
}